

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS ref_metric_isotropic(REF_DBL *metric,REF_GRID ref_grid,REF_DBL *hh)

{
  REF_NODE ref_node;
  uint uVar1;
  REF_DBL *metric_00;
  double *pdVar2;
  undefined8 uVar3;
  REF_DBL *pRVar4;
  REF_STATUS RVar5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  REF_DBL *m;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  REF_DBL d_imply [12];
  REF_DBL d_met [12];
  
  ref_node = ref_grid->node;
  if (ref_node->max < 0) {
    pcVar7 = "malloc metric_imply of REF_DBL negative";
    uVar3 = 0xda1;
LAB_001b817a:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar3,
           "ref_metric_isotropic",pcVar7);
    RVar5 = 1;
  }
  else {
    metric_00 = (REF_DBL *)malloc((ulong)(uint)ref_node->max * 0x30);
    if (metric_00 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xda1,"ref_metric_isotropic","malloc metric_imply of REF_DBL NULL");
      RVar5 = 2;
    }
    else {
      uVar1 = ref_metric_imply_from(metric_00,ref_grid);
      if (uVar1 == 0) {
        pRVar4 = hh + 1;
        m = metric_00;
        for (lVar8 = 0; lVar8 < ref_node->max; lVar8 = lVar8 + 1) {
          if (-1 < ref_node->global[lVar8]) {
            uVar1 = ref_matrix_diag_m(m,d_imply);
            if (uVar1 != 0) {
              uVar6 = (ulong)uVar1;
              pcVar7 = "eigen decomp";
              uVar3 = 0xda8;
              goto LAB_001b814d;
            }
            dVar10 = d_imply[0];
            if (d_imply[0] <= d_imply[1]) {
              dVar10 = d_imply[1];
            }
            if (dVar10 < 0.0) {
              pcVar7 = "neg eig";
              uVar3 = 0xdab;
              goto LAB_001b817a;
            }
            dVar13 = SQRT(dVar10);
            dVar9 = dVar13;
            if (dVar10 < 0.0) {
              dVar9 = sqrt(dVar10);
            }
            if (dVar10 < 0.0) {
              dVar13 = sqrt(dVar10);
            }
            if (dVar13 * *(double *)(&DAT_001ff570 + (ulong)(0.0 < dVar9 * 1e+20) * 8) <= 1.0) {
              pcVar7 = "div zero";
              uVar3 = 0xdac;
              goto LAB_001b817a;
            }
            if (dVar10 < 0.0) {
              dVar10 = sqrt(dVar10);
            }
            else {
              dVar10 = SQRT(dVar10);
            }
            dVar9 = d_imply[0];
            if (d_imply[1] <= d_imply[0]) {
              dVar9 = d_imply[1];
            }
            if (dVar9 < 0.0) {
              pcVar7 = "neg eig";
              uVar3 = 0xdb1;
              goto LAB_001b817a;
            }
            dVar14 = SQRT(dVar9);
            dVar13 = dVar14;
            if (dVar9 < 0.0) {
              dVar13 = sqrt(dVar9);
            }
            if (dVar9 < 0.0) {
              dVar14 = sqrt(dVar9);
            }
            if (dVar14 * *(double *)(&DAT_001ff570 + (ulong)(0.0 < dVar13 * 1e+20) * 8) <= 1.0) {
              pcVar7 = "div zero";
              uVar3 = 0xdb2;
              goto LAB_001b817a;
            }
            if (dVar9 < 0.0) {
              dVar9 = sqrt(dVar9);
            }
            else {
              dVar9 = SQRT(dVar9);
            }
            dVar10 = 1.0 / dVar10;
            auVar11._0_8_ = (1.0 / dVar9) * 1e+20;
            auVar11._8_8_ = dVar10;
            auVar12._8_8_ = -dVar10;
            auVar12._0_8_ = -auVar11._0_8_;
            auVar12 = maxpd(auVar11,auVar12);
            if (auVar12._0_8_ <= auVar12._8_8_) {
              pcVar7 = "div zero";
              uVar3 = 0xdb5;
              goto LAB_001b817a;
            }
            uVar1 = ref_matrix_diag_m(metric,d_met);
            if (uVar1 != 0) {
              uVar6 = (ulong)uVar1;
              pcVar7 = "eigen decomp";
              uVar3 = 0xdb8;
              goto LAB_001b814d;
            }
            uVar1 = ref_matrix_descending_eig(d_met);
            if (uVar1 != 0) {
              uVar6 = (ulong)uVar1;
              pcVar7 = "really descend?";
              uVar3 = 0xdb9;
              goto LAB_001b814d;
            }
            pdVar2 = d_met + 1;
            if (0.5 <= dVar10 / (1.0 / dVar9)) {
              pdVar2 = d_met;
            }
            dVar10 = *pdVar2;
            if (dVar10 < 0.0) {
              pcVar7 = "neg eig";
              uVar3 = 0xdbf;
              goto LAB_001b817a;
            }
            dVar13 = SQRT(dVar10);
            dVar9 = dVar13;
            if (dVar10 < 0.0) {
              dVar9 = sqrt(dVar10);
            }
            if (dVar10 < 0.0) {
              dVar13 = sqrt(dVar10);
            }
            if (dVar13 * *(double *)(&DAT_001ff570 + (ulong)(0.0 < dVar9 * 1e+20) * 8) <= 1.0) {
              pcVar7 = "div zero";
              uVar3 = 0xdc0;
              goto LAB_001b817a;
            }
            if (dVar10 < 0.0) {
              dVar10 = sqrt(dVar10);
            }
            else {
              dVar10 = SQRT(dVar10);
            }
            pRVar4[-1] = 1.0 / dVar10;
            *pRVar4 = 0.5;
          }
          pRVar4 = pRVar4 + 2;
          metric = metric + 6;
          m = m + 6;
        }
        uVar1 = ref_node_ghost_dbl(ref_node,hh,2);
        if (uVar1 == 0) {
          free(metric_00);
          return 0;
        }
        uVar6 = (ulong)uVar1;
        pcVar7 = "update ghosts";
        uVar3 = 0xdc7;
      }
      else {
        uVar6 = (ulong)uVar1;
        pcVar7 = "imply";
        uVar3 = 0xda2;
      }
LAB_001b814d:
      RVar5 = (REF_STATUS)uVar6;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             uVar3,"ref_metric_isotropic",uVar6,pcVar7);
    }
  }
  return RVar5;
}

Assistant:

REF_FCN REF_STATUS ref_metric_isotropic(REF_DBL *metric, REF_GRID ref_grid,
                                        REF_DBL *hh) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node;
  REF_DBL *metric_imply;
  ref_malloc(metric_imply, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  RSS(ref_metric_imply_from(metric_imply, ref_grid), "imply");

  each_ref_node_valid_node(ref_node, node) {
    REF_DBL e, d_imply[12], hmin, hmax, d_met[12], h;
    REF_DBL ar;

    RSS(ref_matrix_diag_m(&(metric_imply[6 * node]), d_imply), "eigen decomp");
    e = MAX(MAX(ref_matrix_eig(d_imply, 0), ref_matrix_eig(d_imply, 1)),
            ref_matrix_eig(d_imply, 1));
    RAS(e >= 0, "neg eig");
    RAS(ref_math_divisible(1.0, sqrt(e)), "div zero");
    hmin = 1.0 / sqrt(e);

    e = MIN(MIN(ref_matrix_eig(d_imply, 0), ref_matrix_eig(d_imply, 1)),
            ref_matrix_eig(d_imply, 1));
    RAS(e >= 0, "neg eig");
    RAS(ref_math_divisible(1.0, sqrt(e)), "div zero");
    hmax = 1.0 / sqrt(e);

    RAS(ref_math_divisible(hmin, hmax), "div zero");
    ar = hmin / hmax;

    RSS(ref_matrix_diag_m(&(metric[6 * node]), d_met), "eigen decomp");
    RSS(ref_matrix_descending_eig(d_met), "really descend?");
    if (ar < 0.5) {
      e = ref_matrix_eig(d_met, 1);
    } else {
      e = ref_matrix_eig(d_met, 0);
    }
    RAS(e >= 0, "neg eig");
    RAS(ref_math_divisible(1.0, sqrt(e)), "div zero");
    h = 1.0 / sqrt(e);

    hh[0 + 2 * node] = h;
    hh[1 + 2 * node] = 0.5; /* CADENCE/Pointwise typical decay rate */
  }

  RSS(ref_node_ghost_dbl(ref_node, hh, 2), "update ghosts");

  ref_free(metric_imply);

  return REF_SUCCESS;
}